

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_atan>(Mat *a,Option *opt)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [32];
  undefined1 auVar51 [16];
  long *in_RDI;
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  float fVar56;
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_atan op;
  Mat *m;
  __m512 output_approx;
  __m512 fourth_power_of_input_approx;
  __m512 square_of_input_approx;
  __m512 input_approx;
  __mmask16 is_small_input;
  __m512 absolute;
  __m512 negative_mask;
  __m512 magic_a8;
  __m512 magic_a7;
  __m512 magic_a6;
  __m512 magic_a5;
  __m512 magic_a4;
  __m512 magic_a3;
  __m512 magic_a2;
  __m512 magic_a1;
  __m512 magic_a0;
  __m512 magic_half_pi;
  __m512 magic_negative_one;
  __m512 magic_one;
  __m512 magic_negative_zero;
  __m256 output_approx_1;
  __m256 fourth_power_of_input_approx_1;
  __m256 square_of_input_approx_1;
  __m256 input_approx_1;
  __m256 is_small_input_1;
  __m256 absolute_1;
  __m256 negative_mask_1;
  __m256 magic_a8_1;
  __m256 magic_a7_1;
  __m256 magic_a6_1;
  __m256 magic_a5_1;
  __m256 magic_a4_1;
  __m256 magic_a3_1;
  __m256 magic_a2_1;
  __m256 magic_a1_1;
  __m256 magic_a0_1;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one_1;
  __m256 magic_one_1;
  __m256 magic_negative_zero_1;
  __m128 output_approx_2;
  __m128 fourth_power_of_input_approx_2;
  __m128 square_of_input_approx_2;
  __m128 input_approx_2;
  __m128 is_small_input_2;
  __m128 absolute_2;
  __m128 negative_mask_2;
  __m128 magic_a8_2;
  __m128 magic_a7_2;
  __m128 magic_a6_2;
  __m128 magic_a5_2;
  __m128 magic_a4_2;
  __m128 magic_a3_2;
  __m128 magic_a2_2;
  __m128 magic_a1_2;
  __m128 magic_a0_2;
  __m128 magic_half_pi_2;
  __m128 magic_negative_one_2;
  __m128 magic_one_2;
  __m128 magic_negative_zero_2;
  undefined1 local_3130 [16];
  undefined1 local_3120 [32];
  undefined1 local_3100 [64];
  int local_30bc;
  undefined8 local_30b8;
  undefined8 local_30b0;
  undefined8 local_30a8;
  undefined4 local_30a0;
  long local_3098;
  undefined4 local_3090;
  undefined4 local_308c;
  undefined4 local_3088;
  undefined4 local_3084;
  undefined4 local_3080;
  undefined8 local_3078;
  undefined1 (*local_3070) [64];
  int local_3068;
  int local_3064;
  int local_3060;
  int local_305c;
  int local_3058;
  int local_3054;
  int local_3050;
  undefined1 local_3049 [9];
  long *local_3040;
  undefined1 local_3035;
  int local_3034;
  undefined8 *local_3028;
  undefined8 *local_3020;
  undefined8 *local_3010;
  undefined1 (*local_3008) [64];
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 uStack_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined1 (*local_2f90) [64];
  undefined1 (*local_2f88) [64];
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined1 (*local_2f60) [64];
  undefined1 (*local_2f58) [64];
  undefined8 local_2f50;
  undefined8 uStack_2f48;
  undefined1 (*local_2f40) [64];
  long local_2f38;
  undefined4 local_2f2c;
  long local_2f28;
  undefined1 (*local_2f20) [64];
  undefined4 local_2f14;
  int local_2f10;
  int local_2f0c;
  undefined8 *local_2f08;
  undefined4 local_2efc;
  long local_2ef8;
  undefined8 *local_2ee8;
  undefined1 *local_2ec0;
  undefined1 *local_2eb8;
  undefined1 *local_2eb0;
  undefined1 *local_2ea8;
  undefined1 *local_2ea0;
  undefined1 *local_2e98;
  undefined1 (*local_2e90) [64];
  undefined1 *local_2e88;
  undefined1 local_2e80 [64];
  undefined1 local_2e40 [64];
  undefined1 local_2e00 [64];
  undefined1 local_2dc0 [64];
  ushort local_2d42;
  undefined1 local_2d40 [64];
  undefined1 local_2d00 [64];
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 uStack_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 uStack_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 uStack_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 uStack_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 uStack_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 uStack_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 uStack_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 uStack_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 uStack_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 uStack_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 uStack_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 uStack_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 uStack_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 uStack_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 uStack_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 uStack_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 uStack_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 uStack_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 uStack_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 uStack_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 uStack_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined1 local_2740 [64];
  undefined1 local_2700 [64];
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 uStack_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined1 local_2640 [64];
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [64];
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 uStack_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 uStack_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined1 local_24c0 [64];
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 uStack_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 uStack_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 uStack_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined1 local_2340 [64];
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 uStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined1 local_2280 [64];
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 uStack_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 uStack_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  int local_2140;
  int iStack_213c;
  int iStack_2138;
  int iStack_2134;
  int iStack_2130;
  int iStack_212c;
  int iStack_2128;
  int iStack_2124;
  int iStack_2120;
  int iStack_211c;
  int iStack_2118;
  int iStack_2114;
  int iStack_2110;
  int iStack_210c;
  int iStack_2108;
  int iStack_2104;
  undefined1 local_2100 [64];
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined1 local_2080 [64];
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined1 local_1fc0 [64];
  undefined4 local_1f44;
  undefined1 local_1f40 [64];
  undefined4 local_1ec4;
  undefined1 local_1ec0 [64];
  undefined4 local_1e44;
  undefined1 local_1e40 [64];
  undefined4 local_1dc4;
  undefined1 local_1dc0 [64];
  undefined4 local_1d44;
  undefined1 local_1d40 [64];
  undefined4 local_1cc4;
  undefined1 local_1cc0 [64];
  undefined4 local_1c44;
  undefined1 local_1c40 [64];
  undefined4 local_1bc4;
  undefined1 local_1bc0 [64];
  undefined4 local_1b44;
  undefined1 local_1b40 [64];
  undefined4 local_1ac4;
  undefined1 local_1ac0 [64];
  undefined4 local_1a44;
  undefined1 local_1a40 [64];
  undefined4 local_19c4;
  undefined1 local_19c0 [64];
  undefined4 local_1944;
  uint local_1940;
  uint uStack_193c;
  uint uStack_1938;
  uint uStack_1934;
  uint uStack_1930;
  uint uStack_192c;
  uint uStack_1928;
  uint uStack_1924;
  uint uStack_1920;
  uint uStack_191c;
  uint uStack_1918;
  uint uStack_1914;
  uint uStack_1910;
  uint uStack_190c;
  uint uStack_1908;
  uint uStack_1904;
  uint local_1900;
  uint uStack_18fc;
  uint uStack_18f8;
  uint uStack_18f4;
  uint uStack_18f0;
  uint uStack_18ec;
  uint uStack_18e8;
  uint uStack_18e4;
  uint uStack_18e0;
  uint uStack_18dc;
  uint uStack_18d8;
  uint uStack_18d4;
  uint uStack_18d0;
  uint uStack_18cc;
  uint uStack_18c8;
  uint uStack_18c4;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 uStack_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  ushort local_1842;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  ushort local_1782;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  ushort local_16c2;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [8];
  float fStack_1598;
  float fStack_1594;
  float local_1580;
  float fStack_157c;
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  undefined4 uStack_1564;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  undefined4 uStack_1544;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  undefined4 uStack_11d0;
  undefined4 uStack_11cc;
  undefined4 uStack_11c8;
  undefined4 uStack_11c4;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined1 *local_1140;
  undefined1 *local_1138;
  float *local_1130;
  undefined8 *local_1128;
  undefined1 *local_1120;
  float *local_1118;
  undefined8 *local_1110;
  undefined1 *local_1108;
  float *local_1100;
  undefined8 *local_10f8;
  undefined1 *local_10f0;
  float *local_10e8;
  undefined8 *local_10e0;
  undefined8 *local_10d8;
  float *local_10d0;
  undefined8 *local_10c8;
  undefined1 *local_10c0;
  float *local_10b8;
  undefined8 *local_10b0;
  undefined1 *local_10a8;
  float *local_10a0;
  undefined8 *local_1098;
  undefined8 *local_1090;
  float *local_1088;
  undefined1 local_1080 [8];
  float fStack_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  float fStack_1064;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  undefined4 uStack_1044;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  float local_d20;
  float fStack_d1c;
  float fStack_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float fStack_d08;
  float fStack_d04;
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined4 local_bb4;
  undefined4 local_bb0;
  undefined4 local_bac;
  undefined4 local_ba8;
  undefined4 local_ba4;
  undefined4 local_ba0;
  undefined4 local_b9c;
  undefined4 local_b98;
  undefined4 local_b94;
  undefined4 local_b90;
  undefined4 local_b8c;
  undefined4 local_b88;
  undefined4 local_b84;
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [16];
  undefined1 auStack_b30 [16];
  undefined4 local_b20;
  undefined4 local_b1c;
  undefined4 local_b18;
  undefined4 local_b14;
  undefined4 local_b10;
  undefined4 local_b0c;
  undefined4 local_b08;
  undefined4 local_b04;
  undefined1 local_b00 [16];
  undefined1 auStack_af0 [16];
  undefined4 local_ae0;
  undefined4 local_adc;
  undefined4 local_ad8;
  undefined4 local_ad4;
  undefined4 local_ad0;
  undefined4 local_acc;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined1 local_ac0 [16];
  undefined1 auStack_ab0 [16];
  undefined4 local_aa0;
  undefined4 local_a9c;
  undefined4 local_a98;
  undefined4 local_a94;
  undefined4 local_a90;
  undefined4 local_a8c;
  undefined4 local_a88;
  undefined4 local_a84;
  undefined1 local_a80 [16];
  undefined1 auStack_a70 [16];
  undefined4 local_a60;
  undefined4 local_a5c;
  undefined4 local_a58;
  undefined4 local_a54;
  undefined4 local_a50;
  undefined4 local_a4c;
  undefined4 local_a48;
  undefined4 local_a44;
  undefined1 local_a40 [16];
  undefined1 auStack_a30 [16];
  undefined4 local_a20;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  undefined4 local_a0c;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined1 local_a00 [16];
  undefined1 auStack_9f0 [16];
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined1 local_9c0 [16];
  undefined1 auStack_9b0 [16];
  undefined4 local_9a0;
  undefined4 local_99c;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined4 local_984;
  undefined1 local_980 [16];
  undefined1 auStack_970 [16];
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined4 local_954;
  undefined4 local_950;
  undefined4 local_94c;
  undefined4 local_948;
  undefined4 local_944;
  undefined1 local_940 [16];
  undefined1 auStack_930 [16];
  undefined4 local_920;
  undefined4 local_91c;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  undefined4 local_904;
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined4 local_8e0;
  undefined4 local_8dc;
  undefined4 local_8d8;
  undefined4 local_8d4;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [16];
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined4 local_894;
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_884;
  undefined1 local_880 [16];
  undefined1 auStack_870 [16];
  undefined4 local_860;
  undefined4 local_85c;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined4 local_844;
  undefined1 local_840 [16];
  undefined1 auStack_830 [16];
  undefined4 local_820;
  undefined4 local_81c;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined4 local_804;
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float local_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float local_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 *local_540;
  undefined1 *local_538;
  float *local_530;
  undefined8 *local_528;
  undefined1 *local_520;
  float *local_518;
  undefined8 *local_510;
  undefined1 *local_508;
  float *local_500;
  undefined8 *local_4f8;
  undefined1 *local_4f0;
  float *local_4e8;
  undefined8 *local_4e0;
  undefined8 *local_4d8;
  float *local_4d0;
  undefined8 *local_4c8;
  undefined1 *local_4c0;
  float *local_4b8;
  undefined8 *local_4b0;
  undefined1 *local_4a8;
  float *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  float *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  float local_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_54;
  
  local_3050 = *(int *)((long)in_RDI + 0x2c);
  local_3054 = (int)in_RDI[6];
  local_3058 = *(int *)((long)in_RDI + 0x34);
  local_305c = (int)in_RDI[7];
  local_3060 = (int)in_RDI[3];
  local_3064 = local_3050 * local_3054 * local_3058 * local_3060;
  local_3040 = in_RDI;
  for (local_3068 = 0; local_3068 < local_305c; local_3068 = local_3068 + 1) {
    local_3028 = &local_30b8;
    local_2f0c = *(int *)((long)local_3040 + 0x2c);
    local_2f10 = (int)local_3040[6];
    local_2f14 = *(undefined4 *)((long)local_3040 + 0x34);
    local_2f20 = (undefined1 (*) [64])
                 (*local_3040 + local_3040[8] * (long)local_3068 * local_3040[2]);
    local_2f28 = local_3040[2];
    local_2f2c = (undefined4)local_3040[3];
    local_2f38 = local_3040[4];
    local_2f08 = &local_30b8;
    local_2ef8 = (long)local_2f0c * (long)local_2f10 * local_2f28;
    local_3020 = &local_30b8;
    local_3010 = &local_30b8;
    local_2efc = 0x10;
    local_3034 = local_3068;
    local_3035 = 1;
    local_30b8 = 0;
    local_30a8 = 0;
    local_30a0 = 0;
    local_3090 = 0;
    local_308c = 0;
    local_3088 = 0;
    local_3084 = 0;
    local_3080 = 0;
    local_3078 = 0;
    local_30b0 = 0;
    local_3070 = local_2f20;
    for (local_30bc = 0; local_30bc + 0xf < local_3064; local_30bc = local_30bc + 0x10) {
      local_3008 = local_3070;
      auVar55 = *local_3070;
      local_2eb8 = local_3049;
      local_2ec0 = local_3100;
      local_3100._0_8_ = auVar55._0_8_;
      local_2980 = local_3100._0_8_;
      local_3100._8_8_ = auVar55._8_8_;
      uStack_2978 = local_3100._8_8_;
      local_3100._16_8_ = auVar55._16_8_;
      uStack_2970 = local_3100._16_8_;
      local_3100._24_8_ = auVar55._24_8_;
      uStack_2968 = local_3100._24_8_;
      local_3100._32_8_ = auVar55._32_8_;
      uStack_2960 = local_3100._32_8_;
      local_3100._40_8_ = auVar55._40_8_;
      uStack_2958 = local_3100._40_8_;
      local_3100._48_8_ = auVar55._48_8_;
      uStack_2950 = local_3100._48_8_;
      local_3100._56_8_ = auVar55._56_8_;
      uStack_2948 = local_3100._56_8_;
      local_1944 = 0x80000000;
      local_19c0 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      local_29c0 = local_19c0._0_8_;
      uStack_29b8 = local_19c0._8_8_;
      uStack_29b0 = local_19c0._16_8_;
      uStack_29a8 = local_19c0._24_8_;
      uStack_29a0 = local_19c0._32_8_;
      uStack_2998 = local_19c0._40_8_;
      uStack_2990 = local_19c0._48_8_;
      uStack_2988 = local_19c0._56_8_;
      local_19c4 = 0x3f800000;
      local_1a40 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_2a00 = local_1a40._0_8_;
      uStack_29f8 = local_1a40._8_8_;
      uStack_29f0 = local_1a40._16_8_;
      uStack_29e8 = local_1a40._24_8_;
      uStack_29e0 = local_1a40._32_8_;
      uStack_29d8 = local_1a40._40_8_;
      uStack_29d0 = local_1a40._48_8_;
      uStack_29c8 = local_1a40._56_8_;
      local_1a44 = 0xbf800000;
      local_1ac0 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
      local_2a40 = local_1ac0._0_8_;
      uStack_2a38 = local_1ac0._8_8_;
      uStack_2a30 = local_1ac0._16_8_;
      uStack_2a28 = local_1ac0._24_8_;
      uStack_2a20 = local_1ac0._32_8_;
      uStack_2a18 = local_1ac0._40_8_;
      uStack_2a10 = local_1ac0._48_8_;
      uStack_2a08 = local_1ac0._56_8_;
      local_1ac4 = 0x3fc90fdb;
      local_1b40 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      local_2a80 = local_1b40._0_8_;
      uStack_2a78 = local_1b40._8_8_;
      uStack_2a70 = local_1b40._16_8_;
      uStack_2a68 = local_1b40._24_8_;
      uStack_2a60 = local_1b40._32_8_;
      uStack_2a58 = local_1b40._40_8_;
      uStack_2a50 = local_1b40._48_8_;
      uStack_2a48 = local_1b40._56_8_;
      local_1b44 = 0x3f800000;
      local_1bc0 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_2ac0 = local_1bc0._0_8_;
      uStack_2ab8 = local_1bc0._8_8_;
      uStack_2ab0 = local_1bc0._16_8_;
      uStack_2aa8 = local_1bc0._24_8_;
      uStack_2aa0 = local_1bc0._32_8_;
      uStack_2a98 = local_1bc0._40_8_;
      uStack_2a90 = local_1bc0._48_8_;
      uStack_2a88 = local_1bc0._56_8_;
      local_1bc4 = 0xbeaaaa53;
      local_1c40 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      local_2b00 = local_1c40._0_8_;
      uStack_2af8 = local_1c40._8_8_;
      uStack_2af0 = local_1c40._16_8_;
      uStack_2ae8 = local_1c40._24_8_;
      uStack_2ae0 = local_1c40._32_8_;
      uStack_2ad8 = local_1c40._40_8_;
      uStack_2ad0 = local_1c40._48_8_;
      uStack_2ac8 = local_1c40._56_8_;
      local_1c44 = 0x3e4cb974;
      local_1cc0 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      local_2b40 = local_1cc0._0_8_;
      uStack_2b38 = local_1cc0._8_8_;
      uStack_2b30 = local_1cc0._16_8_;
      uStack_2b28 = local_1cc0._24_8_;
      uStack_2b20 = local_1cc0._32_8_;
      uStack_2b18 = local_1cc0._40_8_;
      uStack_2b10 = local_1cc0._48_8_;
      uStack_2b08 = local_1cc0._56_8_;
      local_1cc4 = 0xbe117200;
      local_1d40 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      local_2b80 = local_1d40._0_8_;
      uStack_2b78 = local_1d40._8_8_;
      uStack_2b70 = local_1d40._16_8_;
      uStack_2b68 = local_1d40._24_8_;
      uStack_2b60 = local_1d40._32_8_;
      uStack_2b58 = local_1d40._40_8_;
      uStack_2b50 = local_1d40._48_8_;
      uStack_2b48 = local_1d40._56_8_;
      local_1d44 = 0x3dd9ed24;
      local_1dc0 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      local_2bc0 = local_1dc0._0_8_;
      uStack_2bb8 = local_1dc0._8_8_;
      uStack_2bb0 = local_1dc0._16_8_;
      uStack_2ba8 = local_1dc0._24_8_;
      uStack_2ba0 = local_1dc0._32_8_;
      uStack_2b98 = local_1dc0._40_8_;
      uStack_2b90 = local_1dc0._48_8_;
      uStack_2b88 = local_1dc0._56_8_;
      local_1dc4 = 0xbd99b01e;
      local_1e40 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      local_2c00 = local_1e40._0_8_;
      uStack_2bf8 = local_1e40._8_8_;
      uStack_2bf0 = local_1e40._16_8_;
      uStack_2be8 = local_1e40._24_8_;
      uStack_2be0 = local_1e40._32_8_;
      uStack_2bd8 = local_1e40._40_8_;
      uStack_2bd0 = local_1e40._48_8_;
      uStack_2bc8 = local_1e40._56_8_;
      local_1e44 = 0x3d2edd4e;
      local_1ec0 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      local_2c40 = local_1ec0._0_8_;
      uStack_2c38 = local_1ec0._8_8_;
      uStack_2c30 = local_1ec0._16_8_;
      uStack_2c28 = local_1ec0._24_8_;
      uStack_2c20 = local_1ec0._32_8_;
      uStack_2c18 = local_1ec0._40_8_;
      uStack_2c10 = local_1ec0._48_8_;
      uStack_2c08 = local_1ec0._56_8_;
      local_1ec4 = 0xbc83a25c;
      local_1f40 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      local_2c80 = local_1f40._0_8_;
      uStack_2c78 = local_1f40._8_8_;
      uStack_2c70 = local_1f40._16_8_;
      uStack_2c68 = local_1f40._24_8_;
      uStack_2c60 = local_1f40._32_8_;
      uStack_2c58 = local_1f40._40_8_;
      uStack_2c50 = local_1f40._48_8_;
      uStack_2c48 = local_1f40._56_8_;
      local_1f44 = 0x3b3ac537;
      local_1fc0 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      local_2cc0 = local_1fc0._0_8_;
      uStack_2cb8 = local_1fc0._8_8_;
      uStack_2cb0 = local_1fc0._16_8_;
      uStack_2ca8 = local_1fc0._24_8_;
      uStack_2ca0 = local_1fc0._32_8_;
      uStack_2c98 = local_1fc0._40_8_;
      uStack_2c90 = local_1fc0._48_8_;
      uStack_2c88 = local_1fc0._56_8_;
      local_2900 = local_19c0._0_8_;
      uStack_28f8 = local_19c0._8_8_;
      uStack_28f0 = local_19c0._16_8_;
      uStack_28e8 = local_19c0._24_8_;
      uStack_28e0 = local_19c0._32_8_;
      uStack_28d8 = local_19c0._40_8_;
      uStack_28d0 = local_19c0._48_8_;
      uStack_28c8 = local_19c0._56_8_;
      auVar53 = vmovdqa64_avx512f(local_19c0);
      auVar54 = vmovdqa64_avx512f(auVar55);
      auVar53 = vpandd_avx512f(auVar53,auVar54);
      local_2d00 = vmovdqa64_avx512f(auVar53);
      local_2000 = local_19c0._0_8_;
      uStack_1ff8 = local_19c0._8_8_;
      uStack_1ff0 = local_19c0._16_8_;
      uStack_1fe8 = local_19c0._24_8_;
      uStack_1fe0 = local_19c0._32_8_;
      uStack_1fd8 = local_19c0._40_8_;
      uStack_1fd0 = local_19c0._48_8_;
      uStack_1fc8 = local_19c0._56_8_;
      auVar53 = vmovdqa64_avx512f(local_19c0);
      auVar55 = vmovdqa64_avx512f(auVar55);
      auVar55 = vpandnd_avx512f(auVar53,auVar55);
      local_2d40 = vmovdqa64_avx512f(auVar55);
      uVar4 = vcmpps_avx512f(local_1a40,local_2d40,1);
      local_2d42 = (ushort)uVar4;
      local_1740._0_4_ = local_1ac0._0_4_;
      local_1740._4_4_ = local_1ac0._4_4_;
      uStack_1738._0_4_ = local_1ac0._8_4_;
      uStack_1738._4_4_ = local_1ac0._12_4_;
      uStack_1730._0_4_ = local_1ac0._16_4_;
      uStack_1730._4_4_ = local_1ac0._20_4_;
      uStack_1728._0_4_ = local_1ac0._24_4_;
      uStack_1728._4_4_ = local_1ac0._28_4_;
      uStack_1720._0_4_ = local_1ac0._32_4_;
      uStack_1720._4_4_ = local_1ac0._36_4_;
      uStack_1718._0_4_ = local_1ac0._40_4_;
      uStack_1718._4_4_ = local_1ac0._44_4_;
      uStack_1710._0_4_ = local_1ac0._48_4_;
      uStack_1710._4_4_ = local_1ac0._52_4_;
      uStack_1708._0_4_ = local_1ac0._56_4_;
      uStack_1708._4_4_ = local_1ac0._60_4_;
      local_16c0._0_4_ = local_2d40._0_4_;
      local_16c0._4_4_ = local_2d40._4_4_;
      uStack_16b8._0_4_ = local_2d40._8_4_;
      uStack_16b8._4_4_ = local_2d40._12_4_;
      uStack_16b0._0_4_ = local_2d40._16_4_;
      uStack_16b0._4_4_ = local_2d40._20_4_;
      uStack_16a8._0_4_ = local_2d40._24_4_;
      uStack_16a8._4_4_ = local_2d40._28_4_;
      uStack_16a0._0_4_ = local_2d40._32_4_;
      uStack_16a0._4_4_ = local_2d40._36_4_;
      uStack_1698._0_4_ = local_2d40._40_4_;
      uStack_1698._4_4_ = local_2d40._44_4_;
      uStack_1690._0_4_ = local_2d40._48_4_;
      uStack_1690._4_4_ = local_2d40._52_4_;
      uStack_1688._0_4_ = local_2d40._56_4_;
      uStack_1688._4_4_ = local_2d40._60_4_;
      bVar1 = (byte)uVar4;
      local_1900 = (uint)(bVar1 & 1) * (int)local_1740 | (uint)!(bool)(bVar1 & 1) * (int)local_16c0;
      bVar2 = (bool)((byte)(local_2d42 >> 1) & 1);
      uStack_18fc = (uint)bVar2 * local_1740._4_4_ | (uint)!bVar2 * local_16c0._4_4_;
      bVar2 = (bool)((byte)(local_2d42 >> 2) & 1);
      uStack_18f8 = (uint)bVar2 * (int)uStack_1738 | (uint)!bVar2 * (int)uStack_16b8;
      bVar2 = (bool)((byte)(local_2d42 >> 3) & 1);
      uStack_18f4 = (uint)bVar2 * uStack_1738._4_4_ | (uint)!bVar2 * uStack_16b8._4_4_;
      bVar2 = (bool)((byte)(local_2d42 >> 4) & 1);
      uStack_18f0 = (uint)bVar2 * (int)uStack_1730 | (uint)!bVar2 * (int)uStack_16b0;
      bVar2 = (bool)((byte)(local_2d42 >> 5) & 1);
      uStack_18ec = (uint)bVar2 * uStack_1730._4_4_ | (uint)!bVar2 * uStack_16b0._4_4_;
      bVar2 = (bool)((byte)(local_2d42 >> 6) & 1);
      uStack_18e8 = (uint)bVar2 * (int)uStack_1728 | (uint)!bVar2 * (int)uStack_16a8;
      bVar2 = (bool)((byte)(local_2d42 >> 7) & 1);
      uStack_18e4 = (uint)bVar2 * uStack_1728._4_4_ | (uint)!bVar2 * uStack_16a8._4_4_;
      bVar3 = (byte)((ulong)uVar4 >> 8);
      uStack_18e0 = (uint)(bVar3 & 1) * (int)uStack_1720 |
                    (uint)!(bool)(bVar3 & 1) * (int)uStack_16a0;
      bVar2 = (bool)(bVar3 >> 1 & 1);
      uStack_18dc = (uint)bVar2 * uStack_1720._4_4_ | (uint)!bVar2 * uStack_16a0._4_4_;
      bVar2 = (bool)(bVar3 >> 2 & 1);
      uStack_18d8 = (uint)bVar2 * (int)uStack_1718 | (uint)!bVar2 * (int)uStack_1698;
      bVar2 = (bool)(bVar3 >> 3 & 1);
      uStack_18d4 = (uint)bVar2 * uStack_1718._4_4_ | (uint)!bVar2 * uStack_1698._4_4_;
      bVar2 = (bool)(bVar3 >> 4 & 1);
      uStack_18d0 = (uint)bVar2 * (int)uStack_1710 | (uint)!bVar2 * (int)uStack_1690;
      bVar2 = (bool)(bVar3 >> 5 & 1);
      uStack_18cc = (uint)bVar2 * uStack_1710._4_4_ | (uint)!bVar2 * uStack_1690._4_4_;
      bVar2 = (bool)(bVar3 >> 6 & 1);
      uStack_18c8 = (uint)bVar2 * (int)uStack_1708 | (uint)!bVar2 * (int)uStack_1688;
      uStack_18c4 = (uint)(bVar3 >> 7) * uStack_1708._4_4_ |
                    (uint)!(bool)(bVar3 >> 7) * uStack_1688._4_4_;
      local_1800 = local_2d40._0_8_;
      uStack_17f8 = local_2d40._8_8_;
      uStack_17f0 = local_2d40._16_8_;
      uStack_17e8 = local_2d40._24_8_;
      uStack_17e0 = local_2d40._32_8_;
      uStack_17d8 = local_2d40._40_8_;
      uStack_17d0 = local_2d40._48_8_;
      uStack_17c8 = local_2d40._56_8_;
      local_1780._0_4_ = local_1a40._0_4_;
      local_1780._4_4_ = local_1a40._4_4_;
      uStack_1778._0_4_ = local_1a40._8_4_;
      uStack_1778._4_4_ = local_1a40._12_4_;
      uStack_1770._0_4_ = local_1a40._16_4_;
      uStack_1770._4_4_ = local_1a40._20_4_;
      uStack_1768._0_4_ = local_1a40._24_4_;
      uStack_1768._4_4_ = local_1a40._28_4_;
      uStack_1760._0_4_ = local_1a40._32_4_;
      uStack_1760._4_4_ = local_1a40._36_4_;
      uStack_1758._0_4_ = local_1a40._40_4_;
      uStack_1758._4_4_ = local_1a40._44_4_;
      uStack_1750._0_4_ = local_1a40._48_4_;
      uStack_1750._4_4_ = local_1a40._52_4_;
      uStack_1748._0_4_ = local_1a40._56_4_;
      uStack_1748._4_4_ = local_1a40._60_4_;
      local_1940 = (uint)(bVar1 & 1) * (int)local_16c0 | (uint)!(bool)(bVar1 & 1) * (int)local_1780;
      bVar2 = (bool)((byte)(local_2d42 >> 1) & 1);
      uStack_193c = (uint)bVar2 * local_16c0._4_4_ | (uint)!bVar2 * local_1780._4_4_;
      bVar2 = (bool)((byte)(local_2d42 >> 2) & 1);
      uStack_1938 = (uint)bVar2 * (int)uStack_16b8 | (uint)!bVar2 * (int)uStack_1778;
      bVar2 = (bool)((byte)(local_2d42 >> 3) & 1);
      uStack_1934 = (uint)bVar2 * uStack_16b8._4_4_ | (uint)!bVar2 * uStack_1778._4_4_;
      bVar2 = (bool)((byte)(local_2d42 >> 4) & 1);
      uStack_1930 = (uint)bVar2 * (int)uStack_16b0 | (uint)!bVar2 * (int)uStack_1770;
      bVar2 = (bool)((byte)(local_2d42 >> 5) & 1);
      uStack_192c = (uint)bVar2 * uStack_16b0._4_4_ | (uint)!bVar2 * uStack_1770._4_4_;
      bVar2 = (bool)((byte)(local_2d42 >> 6) & 1);
      uStack_1928 = (uint)bVar2 * (int)uStack_16a8 | (uint)!bVar2 * (int)uStack_1768;
      bVar2 = (bool)((byte)(local_2d42 >> 7) & 1);
      uStack_1924 = (uint)bVar2 * uStack_16a8._4_4_ | (uint)!bVar2 * uStack_1768._4_4_;
      uStack_1920 = (uint)(bVar3 & 1) * (int)uStack_16a0 |
                    (uint)!(bool)(bVar3 & 1) * (int)uStack_1760;
      bVar2 = (bool)(bVar3 >> 1 & 1);
      uStack_191c = (uint)bVar2 * uStack_16a0._4_4_ | (uint)!bVar2 * uStack_1760._4_4_;
      bVar2 = (bool)(bVar3 >> 2 & 1);
      uStack_1918 = (uint)bVar2 * (int)uStack_1698 | (uint)!bVar2 * (int)uStack_1758;
      bVar2 = (bool)(bVar3 >> 3 & 1);
      uStack_1914 = (uint)bVar2 * uStack_1698._4_4_ | (uint)!bVar2 * uStack_1758._4_4_;
      bVar2 = (bool)(bVar3 >> 4 & 1);
      uStack_1910 = (uint)bVar2 * (int)uStack_1690 | (uint)!bVar2 * (int)uStack_1750;
      bVar2 = (bool)(bVar3 >> 5 & 1);
      uStack_190c = (uint)bVar2 * uStack_1690._4_4_ | (uint)!bVar2 * uStack_1750._4_4_;
      bVar2 = (bool)(bVar3 >> 6 & 1);
      uStack_1908 = (uint)bVar2 * (int)uStack_1688 | (uint)!bVar2 * (int)uStack_1748;
      uStack_1904 = (uint)(bVar3 >> 7) * uStack_1688._4_4_ |
                    (uint)!(bool)(bVar3 >> 7) * uStack_1748._4_4_;
      auVar54._4_4_ = uStack_18fc;
      auVar54._0_4_ = local_1900;
      auVar54._8_4_ = uStack_18f8;
      auVar54._12_4_ = uStack_18f4;
      auVar54._16_4_ = uStack_18f0;
      auVar54._20_4_ = uStack_18ec;
      auVar54._24_4_ = uStack_18e8;
      auVar54._28_4_ = uStack_18e4;
      auVar54._32_4_ = uStack_18e0;
      auVar54._36_4_ = uStack_18dc;
      auVar54._40_4_ = uStack_18d8;
      auVar54._44_4_ = uStack_18d4;
      auVar54._48_4_ = uStack_18d0;
      auVar54._52_4_ = uStack_18cc;
      auVar54._56_4_ = uStack_18c8;
      auVar54._60_4_ = uStack_18c4;
      auVar53._4_4_ = uStack_193c;
      auVar53._0_4_ = local_1940;
      auVar53._8_4_ = uStack_1938;
      auVar53._12_4_ = uStack_1934;
      auVar53._16_4_ = uStack_1930;
      auVar53._20_4_ = uStack_192c;
      auVar53._24_4_ = uStack_1928;
      auVar53._28_4_ = uStack_1924;
      auVar53._32_4_ = uStack_1920;
      auVar53._36_4_ = uStack_191c;
      auVar53._40_4_ = uStack_1918;
      auVar53._44_4_ = uStack_1914;
      auVar53._48_4_ = uStack_1910;
      auVar53._52_4_ = uStack_190c;
      auVar53._56_4_ = uStack_1908;
      auVar53._60_4_ = uStack_1904;
      local_2dc0 = vdivps_avx512f(auVar54,auVar53);
      local_27c0 = local_2dc0._0_8_;
      uStack_27b8 = local_2dc0._8_8_;
      uStack_27b0 = local_2dc0._16_8_;
      uStack_27a8 = local_2dc0._24_8_;
      uStack_27a0 = local_2dc0._32_8_;
      uStack_2798 = local_2dc0._40_8_;
      uStack_2790 = local_2dc0._48_8_;
      uStack_2788 = local_2dc0._56_8_;
      local_2e00 = vmulps_avx512f(local_2dc0,local_2dc0);
      local_2840 = local_2e00._0_8_;
      uStack_2838 = local_2e00._8_8_;
      uStack_2830 = local_2e00._16_8_;
      uStack_2828 = local_2e00._24_8_;
      uStack_2820 = local_2e00._32_8_;
      uStack_2818 = local_2e00._40_8_;
      uStack_2810 = local_2e00._48_8_;
      uStack_2808 = local_2e00._56_8_;
      local_2e40 = vmulps_avx512f(local_2e00,local_2e00);
      local_26c0 = local_2e00._0_8_;
      uStack_26b8 = local_2e00._8_8_;
      uStack_26b0 = local_2e00._16_8_;
      uStack_26a8 = local_2e00._24_8_;
      uStack_26a0 = local_2e00._32_8_;
      uStack_2698 = local_2e00._40_8_;
      uStack_2690 = local_2e00._48_8_;
      uStack_2688 = local_2e00._56_8_;
      local_2300 = local_2e40._0_8_;
      uStack_22f8 = local_2e40._8_8_;
      uStack_22f0 = local_2e40._16_8_;
      uStack_22e8 = local_2e40._24_8_;
      uStack_22e0 = local_2e40._32_8_;
      uStack_22d8 = local_2e40._40_8_;
      uStack_22d0 = local_2e40._48_8_;
      uStack_22c8 = local_2e40._56_8_;
      local_21c0 = local_1f40._0_8_;
      uStack_21b8 = local_1f40._8_8_;
      uStack_21b0 = local_1f40._16_8_;
      uStack_21a8 = local_1f40._24_8_;
      uStack_21a0 = local_1f40._32_8_;
      uStack_2198 = local_1f40._40_8_;
      uStack_2190 = local_1f40._48_8_;
      uStack_2188 = local_1f40._56_8_;
      local_2200 = local_1e40._0_8_;
      uStack_21f8 = local_1e40._8_8_;
      uStack_21f0 = local_1e40._16_8_;
      uStack_21e8 = local_1e40._24_8_;
      uStack_21e0 = local_1e40._32_8_;
      uStack_21d8 = local_1e40._40_8_;
      uStack_21d0 = local_1e40._48_8_;
      uStack_21c8 = local_1e40._56_8_;
      local_2280 = vfmadd213ps_avx512f(local_1f40,local_2e40,local_1e40);
      local_22c0 = local_1d40._0_8_;
      uStack_22b8 = local_1d40._8_8_;
      uStack_22b0 = local_1d40._16_8_;
      uStack_22a8 = local_1d40._24_8_;
      uStack_22a0 = local_1d40._32_8_;
      uStack_2298 = local_1d40._40_8_;
      uStack_2290 = local_1d40._48_8_;
      uStack_2288 = local_1d40._56_8_;
      local_2340 = vfmadd213ps_avx512f(local_2280,local_2e40,local_1d40);
      local_2380 = local_1c40._0_8_;
      uStack_2378 = local_1c40._8_8_;
      uStack_2370 = local_1c40._16_8_;
      uStack_2368 = local_1c40._24_8_;
      uStack_2360 = local_1c40._32_8_;
      uStack_2358 = local_1c40._40_8_;
      uStack_2350 = local_1c40._48_8_;
      uStack_2348 = local_1c40._56_8_;
      local_2700 = vfmadd213ps_avx512f(local_2340,local_2e40,local_1c40);
      local_2600 = local_2e40._0_8_;
      uStack_25f8 = local_2e40._8_8_;
      uStack_25f0 = local_2e40._16_8_;
      uStack_25e8 = local_2e40._24_8_;
      uStack_25e0 = local_2e40._32_8_;
      uStack_25d8 = local_2e40._40_8_;
      uStack_25d0 = local_2e40._48_8_;
      uStack_25c8 = local_2e40._56_8_;
      local_2400 = local_1fc0._0_8_;
      uStack_23f8 = local_1fc0._8_8_;
      uStack_23f0 = local_1fc0._16_8_;
      uStack_23e8 = local_1fc0._24_8_;
      uStack_23e0 = local_1fc0._32_8_;
      uStack_23d8 = local_1fc0._40_8_;
      uStack_23d0 = local_1fc0._48_8_;
      uStack_23c8 = local_1fc0._56_8_;
      local_2440 = local_1ec0._0_8_;
      uStack_2438 = local_1ec0._8_8_;
      uStack_2430 = local_1ec0._16_8_;
      uStack_2428 = local_1ec0._24_8_;
      uStack_2420 = local_1ec0._32_8_;
      uStack_2418 = local_1ec0._40_8_;
      uStack_2410 = local_1ec0._48_8_;
      uStack_2408 = local_1ec0._56_8_;
      local_24c0 = vfmadd213ps_avx512f(local_1fc0,local_2e40,local_1ec0);
      local_2500 = local_1dc0._0_8_;
      uStack_24f8 = local_1dc0._8_8_;
      uStack_24f0 = local_1dc0._16_8_;
      uStack_24e8 = local_1dc0._24_8_;
      uStack_24e0 = local_1dc0._32_8_;
      uStack_24d8 = local_1dc0._40_8_;
      uStack_24d0 = local_1dc0._48_8_;
      uStack_24c8 = local_1dc0._56_8_;
      local_2580 = vfmadd213ps_avx512f(local_24c0,local_2e40,local_1dc0);
      local_25c0 = local_1cc0._0_8_;
      uStack_25b8 = local_1cc0._8_8_;
      uStack_25b0 = local_1cc0._16_8_;
      uStack_25a8 = local_1cc0._24_8_;
      uStack_25a0 = local_1cc0._32_8_;
      uStack_2598 = local_1cc0._40_8_;
      uStack_2590 = local_1cc0._48_8_;
      uStack_2588 = local_1cc0._56_8_;
      local_2640 = vfmadd213ps_avx512f(local_2580,local_2e40,local_1cc0);
      local_2680 = local_1bc0._0_8_;
      uStack_2678 = local_1bc0._8_8_;
      uStack_2670 = local_1bc0._16_8_;
      uStack_2668 = local_1bc0._24_8_;
      uStack_2660 = local_1bc0._32_8_;
      uStack_2658 = local_1bc0._40_8_;
      uStack_2650 = local_1bc0._48_8_;
      uStack_2648 = local_1bc0._56_8_;
      local_2740 = vfmadd213ps_avx512f(local_2640,local_2e40,local_1bc0);
      local_2e80 = vfmadd213ps_avx512f(local_2700,local_2e00,local_2740);
      local_2880 = local_2e80._0_8_;
      uStack_2878 = local_2e80._8_8_;
      uStack_2870 = local_2e80._16_8_;
      uStack_2868 = local_2e80._24_8_;
      uStack_2860 = local_2e80._32_8_;
      uStack_2858 = local_2e80._40_8_;
      uStack_2850 = local_2e80._48_8_;
      uStack_2848 = local_2e80._56_8_;
      local_28c0 = local_2dc0._0_8_;
      uStack_28b8 = local_2dc0._8_8_;
      uStack_28b0 = local_2dc0._16_8_;
      uStack_28a8 = local_2dc0._24_8_;
      uStack_28a0 = local_2dc0._32_8_;
      uStack_2898 = local_2dc0._40_8_;
      uStack_2890 = local_2dc0._48_8_;
      uStack_2888 = local_2dc0._56_8_;
      local_2100 = vmulps_avx512f(local_2e80,local_2dc0);
      local_18c0 = local_1b40._0_8_;
      uStack_18b8 = local_1b40._8_8_;
      uStack_18b0 = local_1b40._16_8_;
      uStack_18a8 = local_1b40._24_8_;
      uStack_18a0 = local_1b40._32_8_;
      uStack_1898 = local_1b40._40_8_;
      uStack_1890 = local_1b40._48_8_;
      uStack_1888 = local_1b40._56_8_;
      local_1840 = 0;
      uStack_1838 = 0;
      uStack_1830 = 0;
      uStack_1828 = 0;
      uStack_1820 = 0;
      uStack_1818 = 0;
      uStack_1810 = 0;
      uStack_1808 = 0;
      local_2140 = (uint)(bVar1 & 1) * local_1b40._0_4_;
      iStack_213c = (uint)((byte)(local_2d42 >> 1) & 1) * local_1b40._4_4_;
      iStack_2138 = (uint)((byte)(local_2d42 >> 2) & 1) * local_1b40._8_4_;
      iStack_2134 = (uint)((byte)(local_2d42 >> 3) & 1) * local_1b40._12_4_;
      iStack_2130 = (uint)((byte)(local_2d42 >> 4) & 1) * local_1b40._16_4_;
      iStack_212c = (uint)((byte)(local_2d42 >> 5) & 1) * local_1b40._20_4_;
      iStack_2128 = (uint)((byte)(local_2d42 >> 6) & 1) * local_1b40._24_4_;
      iStack_2124 = (uint)((byte)(local_2d42 >> 7) & 1) * local_1b40._28_4_;
      iStack_2120 = (uint)(bVar3 & 1) * local_1b40._32_4_;
      iStack_211c = (uint)(bVar3 >> 1 & 1) * local_1b40._36_4_;
      iStack_2118 = (uint)(bVar3 >> 2 & 1) * local_1b40._40_4_;
      iStack_2114 = (uint)(bVar3 >> 3 & 1) * local_1b40._44_4_;
      iStack_2110 = (uint)(bVar3 >> 4 & 1) * local_1b40._48_4_;
      iStack_210c = (uint)(bVar3 >> 5 & 1) * local_1b40._52_4_;
      iStack_2108 = (uint)(bVar3 >> 6 & 1) * local_1b40._56_4_;
      iStack_2104 = (uint)(bVar3 >> 7) * local_1b40._60_4_;
      auVar55._4_4_ = iStack_213c;
      auVar55._0_4_ = local_2140;
      auVar55._8_4_ = iStack_2138;
      auVar55._12_4_ = iStack_2134;
      auVar55._16_4_ = iStack_2130;
      auVar55._20_4_ = iStack_212c;
      auVar55._24_4_ = iStack_2128;
      auVar55._28_4_ = iStack_2124;
      auVar55._32_4_ = iStack_2120;
      auVar55._36_4_ = iStack_211c;
      auVar55._40_4_ = iStack_2118;
      auVar55._44_4_ = iStack_2114;
      auVar55._48_4_ = iStack_2110;
      auVar55._52_4_ = iStack_210c;
      auVar55._56_4_ = iStack_2108;
      auVar55._60_4_ = iStack_2104;
      local_2080 = vaddps_avx512f(local_2100,auVar55);
      local_20c0 = local_2d00._0_8_;
      uStack_20b8 = local_2d00._8_8_;
      uStack_20b0 = local_2d00._16_8_;
      uStack_20a8 = local_2d00._24_8_;
      uStack_20a0 = local_2d00._32_8_;
      uStack_2098 = local_2d00._40_8_;
      uStack_2090 = local_2d00._48_8_;
      uStack_2088 = local_2d00._56_8_;
      local_3100 = vpord_avx512f(local_2080,local_2d00);
      local_2f90 = local_3070;
      local_3000 = local_3100._0_8_;
      uStack_2ff8 = local_3100._8_8_;
      uStack_2ff0 = local_3100._16_8_;
      uStack_2fe8 = local_3100._24_8_;
      uStack_2fe0 = local_3100._32_8_;
      uStack_2fd8 = local_3100._40_8_;
      uStack_2fd0 = local_3100._48_8_;
      uStack_2fc8 = local_3100._56_8_;
      *local_3070 = local_3100;
      local_3070 = local_3070 + 1;
      local_2940 = local_2980;
      uStack_2938 = uStack_2978;
      uStack_2930 = uStack_2970;
      uStack_2928 = uStack_2968;
      uStack_2920 = uStack_2960;
      uStack_2918 = uStack_2958;
      uStack_2910 = uStack_2950;
      uStack_2908 = uStack_2948;
      local_2800 = local_2840;
      uStack_27f8 = uStack_2838;
      uStack_27f0 = uStack_2830;
      uStack_27e8 = uStack_2828;
      uStack_27e0 = uStack_2820;
      uStack_27d8 = uStack_2818;
      uStack_27d0 = uStack_2810;
      uStack_27c8 = uStack_2808;
      local_2780 = local_27c0;
      uStack_2778 = uStack_27b8;
      uStack_2770 = uStack_27b0;
      uStack_2768 = uStack_27a8;
      uStack_2760 = uStack_27a0;
      uStack_2758 = uStack_2798;
      uStack_2750 = uStack_2790;
      uStack_2748 = uStack_2788;
      local_2540 = local_2600;
      uStack_2538 = uStack_25f8;
      uStack_2530 = uStack_25f0;
      uStack_2528 = uStack_25e8;
      uStack_2520 = uStack_25e0;
      uStack_2518 = uStack_25d8;
      uStack_2510 = uStack_25d0;
      uStack_2508 = uStack_25c8;
      local_2480 = local_2600;
      uStack_2478 = uStack_25f8;
      uStack_2470 = uStack_25f0;
      uStack_2468 = uStack_25e8;
      uStack_2460 = uStack_25e0;
      uStack_2458 = uStack_25d8;
      uStack_2450 = uStack_25d0;
      uStack_2448 = uStack_25c8;
      local_23c0 = local_2600;
      uStack_23b8 = uStack_25f8;
      uStack_23b0 = uStack_25f0;
      uStack_23a8 = uStack_25e8;
      uStack_23a0 = uStack_25e0;
      uStack_2398 = uStack_25d8;
      uStack_2390 = uStack_25d0;
      uStack_2388 = uStack_25c8;
      local_2240 = local_2300;
      uStack_2238 = uStack_22f8;
      uStack_2230 = uStack_22f0;
      uStack_2228 = uStack_22e8;
      uStack_2220 = uStack_22e0;
      uStack_2218 = uStack_22d8;
      uStack_2210 = uStack_22d0;
      uStack_2208 = uStack_22c8;
      local_2180 = local_2300;
      uStack_2178 = uStack_22f8;
      uStack_2170 = uStack_22f0;
      uStack_2168 = uStack_22e8;
      uStack_2160 = uStack_22e0;
      uStack_2158 = uStack_22d8;
      uStack_2150 = uStack_22d0;
      uStack_2148 = uStack_22c8;
      local_2040 = local_2980;
      uStack_2038 = uStack_2978;
      uStack_2030 = uStack_2970;
      uStack_2028 = uStack_2968;
      uStack_2020 = uStack_2960;
      uStack_2018 = uStack_2958;
      uStack_2010 = uStack_2950;
      uStack_2008 = uStack_2948;
      local_1842 = local_2d42;
      local_1782 = local_2d42;
      local_1780 = local_1a40._0_8_;
      uStack_1778 = local_1a40._8_8_;
      uStack_1770 = local_1a40._16_8_;
      uStack_1768 = local_1a40._24_8_;
      uStack_1760 = local_1a40._32_8_;
      uStack_1758 = local_1a40._40_8_;
      uStack_1750 = local_1a40._48_8_;
      uStack_1748 = local_1a40._56_8_;
      local_1740 = local_1ac0._0_8_;
      uStack_1738 = local_1ac0._8_8_;
      uStack_1730 = local_1ac0._16_8_;
      uStack_1728 = local_1ac0._24_8_;
      uStack_1720 = local_1ac0._32_8_;
      uStack_1718 = local_1ac0._40_8_;
      uStack_1710 = local_1ac0._48_8_;
      uStack_1708 = local_1ac0._56_8_;
      local_16c2 = local_2d42;
      local_16c0 = local_2d40._0_8_;
      uStack_16b8 = local_2d40._8_8_;
      uStack_16b0 = local_2d40._16_8_;
      uStack_16a8 = local_2d40._24_8_;
      uStack_16a0 = local_2d40._32_8_;
      uStack_1698 = local_2d40._40_8_;
      uStack_1690 = local_2d40._48_8_;
      uStack_1688 = local_2d40._56_8_;
    }
    for (; local_30bc + 7 < local_3064; local_30bc = local_30bc + 8) {
      local_2f88 = local_3070;
      auVar52 = *(undefined1 (*) [32])*local_3070;
      local_2ea8 = local_3049;
      local_2eb0 = local_3120;
      local_3120._0_8_ = auVar52._0_8_;
      local_1320 = local_3120._0_8_;
      local_3120._8_8_ = auVar52._8_8_;
      uStack_1318 = local_3120._8_8_;
      local_3120._16_8_ = auVar52._16_8_;
      uStack_1310 = local_3120._16_8_;
      local_3120._24_8_ = auVar52._24_8_;
      uStack_1308 = local_3120._24_8_;
      local_b84 = 0x80000000;
      local_b20 = 0x80000000;
      auVar51 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x80000000),0x20);
      local_b40 = vinsertps_avx(auVar51,ZEXT416(0x80000000),0x30);
      auVar51 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x80000000),0x20);
      auStack_b30 = vinsertps_avx(auVar51,ZEXT416(0x80000000),0x30);
      local_1340 = local_b40._0_8_;
      uStack_1338 = local_b40._8_8_;
      uStack_1330 = auStack_b30._0_8_;
      uStack_1328 = auStack_b30._8_8_;
      local_b88 = 0x3f800000;
      local_ae0 = 0x3f800000;
      auVar51 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x3f800000),0x20);
      local_b00 = vinsertps_avx(auVar51,ZEXT416(0x3f800000),0x30);
      auVar51 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x3f800000),0x20);
      auStack_af0 = vinsertps_avx(auVar51,ZEXT416(0x3f800000),0x30);
      local_1360 = local_b00._0_8_;
      uStack_1358 = local_b00._8_8_;
      uStack_1350 = auStack_af0._0_8_;
      uStack_1348 = auStack_af0._8_8_;
      local_b8c = 0xbf800000;
      local_aa0 = 0xbf800000;
      auVar51 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0xbf800000),0x20);
      local_ac0 = vinsertps_avx(auVar51,ZEXT416(0xbf800000),0x30);
      auVar51 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0xbf800000),0x20);
      auStack_ab0 = vinsertps_avx(auVar51,ZEXT416(0xbf800000),0x30);
      local_1380 = local_ac0._0_8_;
      uStack_1378 = local_ac0._8_8_;
      uStack_1370 = auStack_ab0._0_8_;
      uStack_1368 = auStack_ab0._8_8_;
      local_b90 = 0x3fc90fdb;
      local_a60 = 0x3fc90fdb;
      auVar51 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x3fc90fdb),0x20);
      local_a80 = vinsertps_avx(auVar51,ZEXT416(0x3fc90fdb),0x30);
      auVar51 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x3fc90fdb),0x20);
      auStack_a70 = vinsertps_avx(auVar51,ZEXT416(0x3fc90fdb),0x30);
      local_13a0 = local_a80._0_8_;
      uStack_1398 = local_a80._8_8_;
      uStack_1390 = auStack_a70._0_8_;
      uStack_1388 = auStack_a70._8_8_;
      local_b94 = 0x3f800000;
      local_a20 = 0x3f800000;
      auVar51 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x3f800000),0x20);
      local_a40 = vinsertps_avx(auVar51,ZEXT416(0x3f800000),0x30);
      auVar51 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x3f800000),0x20);
      auStack_a30 = vinsertps_avx(auVar51,ZEXT416(0x3f800000),0x30);
      local_13c0 = local_a40._0_8_;
      uStack_13b8 = local_a40._8_8_;
      uStack_13b0 = auStack_a30._0_8_;
      uStack_13a8 = auStack_a30._8_8_;
      local_b98 = 0xbeaaaa53;
      local_9e0 = 0xbeaaaa53;
      auVar51 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0xbeaaaa53),0x20);
      local_a00 = vinsertps_avx(auVar51,ZEXT416(0xbeaaaa53),0x30);
      auVar51 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0xbeaaaa53),0x20);
      auStack_9f0 = vinsertps_avx(auVar51,ZEXT416(0xbeaaaa53),0x30);
      local_13e0 = local_a00._0_8_;
      uStack_13d8 = local_a00._8_8_;
      uStack_13d0 = auStack_9f0._0_8_;
      uStack_13c8 = auStack_9f0._8_8_;
      local_b9c = 0x3e4cb974;
      local_9a0 = 0x3e4cb974;
      auVar51 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x3e4cb974),0x20);
      local_9c0 = vinsertps_avx(auVar51,ZEXT416(0x3e4cb974),0x30);
      auVar51 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x3e4cb974),0x20);
      auStack_9b0 = vinsertps_avx(auVar51,ZEXT416(0x3e4cb974),0x30);
      local_1400 = local_9c0._0_8_;
      uStack_13f8 = local_9c0._8_8_;
      uStack_13f0 = auStack_9b0._0_8_;
      uStack_13e8 = auStack_9b0._8_8_;
      local_ba0 = 0xbe117200;
      local_960 = 0xbe117200;
      auVar51 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0xbe117200),0x20);
      local_980 = vinsertps_avx(auVar51,ZEXT416(0xbe117200),0x30);
      auVar51 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0xbe117200),0x20);
      auStack_970 = vinsertps_avx(auVar51,ZEXT416(0xbe117200),0x30);
      local_1420 = local_980._0_8_;
      uStack_1418 = local_980._8_8_;
      uStack_1410 = auStack_970._0_8_;
      uStack_1408 = auStack_970._8_8_;
      local_ba4 = 0x3dd9ed24;
      local_920 = 0x3dd9ed24;
      auVar51 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x3dd9ed24),0x20);
      local_940 = vinsertps_avx(auVar51,ZEXT416(0x3dd9ed24),0x30);
      auVar51 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x3dd9ed24),0x20);
      auStack_930 = vinsertps_avx(auVar51,ZEXT416(0x3dd9ed24),0x30);
      local_1440 = local_940._0_8_;
      uStack_1438 = local_940._8_8_;
      uStack_1430 = auStack_930._0_8_;
      uStack_1428 = auStack_930._8_8_;
      local_ba8 = 0xbd99b01e;
      local_8e0 = 0xbd99b01e;
      auVar51 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0xbd99b01e),0x20);
      local_900 = vinsertps_avx(auVar51,ZEXT416(0xbd99b01e),0x30);
      auVar51 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0xbd99b01e),0x20);
      auStack_8f0 = vinsertps_avx(auVar51,ZEXT416(0xbd99b01e),0x30);
      local_1460 = local_900._0_8_;
      uStack_1458 = local_900._8_8_;
      uStack_1450 = auStack_8f0._0_8_;
      uStack_1448 = auStack_8f0._8_8_;
      local_bac = 0x3d2edd4e;
      local_8a0 = 0x3d2edd4e;
      auVar51 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x3d2edd4e),0x20);
      local_8c0 = vinsertps_avx(auVar51,ZEXT416(0x3d2edd4e),0x30);
      auVar51 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x3d2edd4e),0x20);
      auStack_8b0 = vinsertps_avx(auVar51,ZEXT416(0x3d2edd4e),0x30);
      local_1480 = local_8c0._0_8_;
      uStack_1478 = local_8c0._8_8_;
      uStack_1470 = auStack_8b0._0_8_;
      uStack_1468 = auStack_8b0._8_8_;
      local_bb0 = 0xbc83a25c;
      local_860 = 0xbc83a25c;
      auVar51 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0xbc83a25c),0x20);
      local_880 = vinsertps_avx(auVar51,ZEXT416(0xbc83a25c),0x30);
      auVar51 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0xbc83a25c),0x20);
      auStack_870 = vinsertps_avx(auVar51,ZEXT416(0xbc83a25c),0x30);
      local_14a0 = local_880._0_8_;
      uStack_1498 = local_880._8_8_;
      uStack_1490 = auStack_870._0_8_;
      uStack_1488 = auStack_870._8_8_;
      local_bb4 = 0x3b3ac537;
      local_820 = 0x3b3ac537;
      auVar51 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x3b3ac537),0x20);
      local_840 = vinsertps_avx(auVar51,ZEXT416(0x3b3ac537),0x30);
      auVar51 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416(0x3b3ac537),0x20);
      auStack_830 = vinsertps_avx(auVar51,ZEXT416(0x3b3ac537),0x30);
      local_14c0 = local_840._0_8_;
      uStack_14b8 = local_840._8_8_;
      uStack_14b0 = auStack_830._0_8_;
      uStack_14a8 = auStack_830._8_8_;
      local_1220 = local_b40._0_8_;
      uStack_1218 = local_b40._8_8_;
      uStack_1210 = auStack_b30._0_8_;
      uStack_1208 = auStack_b30._8_8_;
      auVar14._16_8_ = auStack_b30._0_8_;
      auVar14._0_16_ = local_b40;
      auVar14._24_8_ = auStack_b30._8_8_;
      local_14e0 = vpand_avx2(auVar14,auVar52);
      local_be0 = local_b40._0_8_;
      uStack_bd8 = local_b40._8_8_;
      uStack_bd0 = auStack_b30._0_8_;
      uStack_bc8 = auStack_b30._8_8_;
      auVar17._16_8_ = auStack_b30._0_8_;
      auVar17._0_16_ = local_b40;
      auVar17._24_8_ = auStack_b30._8_8_;
      local_1500 = vpandn_avx2(auVar17,auVar52);
      auVar52._16_8_ = auStack_af0._0_8_;
      auVar52._0_16_ = local_b00;
      auVar52._24_8_ = auStack_af0._8_8_;
      local_1520 = vcmpps_avx(auVar52,local_1500,1);
      local_1260 = local_1520._0_8_;
      uStack_1258 = local_1520._8_8_;
      uStack_1250 = local_1520._16_8_;
      uStack_1248 = local_1520._24_8_;
      local_1280 = local_ac0._0_8_;
      uStack_1278 = local_ac0._8_8_;
      uStack_1270 = auStack_ab0._0_8_;
      uStack_1268 = auStack_ab0._8_8_;
      auVar13._16_8_ = auStack_ab0._0_8_;
      auVar13._0_16_ = local_ac0;
      auVar13._24_8_ = auStack_ab0._8_8_;
      local_ca0 = vpand_avx2(local_1520,auVar13);
      local_c20 = local_1520._0_8_;
      uStack_c18 = local_1520._8_8_;
      uStack_c10 = local_1520._16_8_;
      uStack_c08 = local_1520._24_8_;
      local_c40 = local_1500._0_8_;
      uStack_c38 = local_1500._8_8_;
      uStack_c30 = local_1500._16_8_;
      uStack_c28 = local_1500._24_8_;
      local_cc0 = vpandn_avx2(local_1520,local_1500);
      local_b60 = vpor_avx2(local_ca0,local_cc0);
      local_12a0 = local_1520._0_8_;
      uStack_1298 = local_1520._8_8_;
      uStack_1290 = local_1520._16_8_;
      uStack_1288 = local_1520._24_8_;
      local_12c0 = local_1500._0_8_;
      uStack_12b8 = local_1500._8_8_;
      uStack_12b0 = local_1500._16_8_;
      uStack_12a8 = local_1500._24_8_;
      local_ce0 = vpand_avx2(local_1520,local_1500);
      local_c60 = local_1520._0_8_;
      uStack_c58 = local_1520._8_8_;
      uStack_c50 = local_1520._16_8_;
      uStack_c48 = local_1520._24_8_;
      local_c80 = local_b00._0_8_;
      uStack_c78 = local_b00._8_8_;
      uStack_c70 = auStack_af0._0_8_;
      uStack_c68 = auStack_af0._8_8_;
      auVar52 = vpternlogq_avx512vl(local_1520,local_1520,local_1520,0xf);
      auVar16._16_8_ = auStack_af0._0_8_;
      auVar16._0_16_ = local_b00;
      auVar16._24_8_ = auStack_af0._8_8_;
      local_d00 = vpand_avx2(auVar52,auVar16);
      local_b80 = vpor_avx2(local_ce0,local_d00);
      local_1540 = vdivps_avx(local_b60,local_b80);
      local_1180 = local_1540._0_8_;
      uStack_1178 = local_1540._8_8_;
      uStack_1170 = local_1540._16_8_;
      uStack_1168 = local_1540._24_8_;
      local_1160._0_4_ = local_1540._0_4_;
      local_1160._4_4_ = local_1540._4_4_;
      uStack_1158._0_4_ = local_1540._8_4_;
      uStack_1158._4_4_ = local_1540._12_4_;
      uStack_1150._0_4_ = local_1540._16_4_;
      uStack_1150._4_4_ = local_1540._20_4_;
      uStack_1148._0_4_ = local_1540._24_4_;
      uStack_1148._4_4_ = local_1540._28_4_;
      uStack_1544 = uStack_1148._4_4_;
      local_1560 = (float)local_1160 * (float)local_1160;
      fStack_155c = local_1160._4_4_ * local_1160._4_4_;
      fStack_1558 = (float)uStack_1158 * (float)uStack_1158;
      fStack_1554 = uStack_1158._4_4_ * uStack_1158._4_4_;
      fStack_1550 = (float)uStack_1150 * (float)uStack_1150;
      fStack_154c = uStack_1150._4_4_ * uStack_1150._4_4_;
      fStack_1548 = (float)uStack_1148 * (float)uStack_1148;
      local_11a0 = CONCAT44(fStack_155c,local_1560);
      uStack_1198 = CONCAT44(fStack_1554,fStack_1558);
      uStack_1190 = CONCAT44(fStack_154c,fStack_1550);
      uStack_1188 = CONCAT44(uStack_1148._4_4_,fStack_1548);
      local_11c0 = CONCAT44(fStack_155c,local_1560);
      uStack_11b8 = CONCAT44(fStack_1554,fStack_1558);
      uStack_11b0 = CONCAT44(fStack_154c,fStack_1550);
      uStack_11a8 = CONCAT44(uStack_1148._4_4_,fStack_1548);
      uStack_1564 = uStack_1148._4_4_;
      local_1580 = local_1560 * local_1560;
      fStack_157c = fStack_155c * fStack_155c;
      fStack_1578 = fStack_1558 * fStack_1558;
      fStack_1574 = fStack_1554 * fStack_1554;
      fStack_1570 = fStack_1550 * fStack_1550;
      fStack_156c = fStack_154c * fStack_154c;
      fStack_1568 = fStack_1548 * fStack_1548;
      local_1088 = &local_1580;
      local_1090 = &local_14a0;
      local_1098 = &local_1460;
      local_1000 = CONCAT44(fStack_157c,local_1580);
      uStack_ff8 = CONCAT44(fStack_1574,fStack_1578);
      uStack_ff0 = CONCAT44(fStack_156c,fStack_1570);
      uStack_fe8 = CONCAT44(uStack_1148._4_4_,fStack_1568);
      auVar18._4_4_ = fStack_157c;
      auVar18._0_4_ = local_1580;
      auVar18._8_4_ = fStack_1578;
      auVar18._12_4_ = fStack_1574;
      auVar18._16_4_ = fStack_1570;
      auVar18._20_4_ = fStack_156c;
      auVar18._24_4_ = fStack_1568;
      auVar18._28_4_ = uStack_1148._4_4_;
      local_1020 = local_880._0_8_;
      uStack_1018 = local_880._8_8_;
      uStack_1010 = auStack_870._0_8_;
      uStack_1008 = auStack_870._8_8_;
      auVar27._16_8_ = auStack_870._0_8_;
      auVar27._0_16_ = local_880;
      auVar27._24_8_ = auStack_870._8_8_;
      local_1040 = local_900._0_8_;
      uStack_1038 = local_900._8_8_;
      uStack_1030 = auStack_8f0._0_8_;
      uStack_1028 = auStack_8f0._8_8_;
      auVar29._16_8_ = auStack_8f0._0_8_;
      auVar29._0_16_ = local_900;
      auVar29._24_8_ = auStack_8f0._8_8_;
      auVar51 = vfmadd213ps_fma(auVar27,auVar18,auVar29);
      local_10a0 = &local_1580;
      local_10a8 = local_1600;
      local_10b0 = &local_1420;
      local_fa0 = CONCAT44(fStack_157c,local_1580);
      uStack_f98 = CONCAT44(fStack_1574,fStack_1578);
      uStack_f90 = CONCAT44(fStack_156c,fStack_1570);
      uStack_f88 = CONCAT44(uStack_1148._4_4_,fStack_1568);
      auVar19._4_4_ = fStack_157c;
      auVar19._0_4_ = local_1580;
      auVar19._8_4_ = fStack_1578;
      auVar19._12_4_ = fStack_1574;
      auVar19._16_4_ = fStack_1570;
      auVar19._20_4_ = fStack_156c;
      auVar19._24_4_ = fStack_1568;
      auVar19._28_4_ = uStack_1148._4_4_;
      local_1600._0_8_ = auVar51._0_8_;
      local_fc0 = local_1600._0_8_;
      local_1600._8_8_ = auVar51._8_8_;
      uStack_fb8 = local_1600._8_8_;
      uStack_fb0 = 0;
      uStack_fa8 = 0;
      local_fe0 = local_980._0_8_;
      uStack_fd8 = local_980._8_8_;
      uStack_fd0 = auStack_970._0_8_;
      uStack_fc8 = auStack_970._8_8_;
      auVar31._16_8_ = auStack_970._0_8_;
      auVar31._0_16_ = local_980;
      auVar31._24_8_ = auStack_970._8_8_;
      auVar5 = vfmadd213ps_fma(ZEXT1632(auVar51),auVar19,auVar31);
      local_10b8 = &local_1580;
      local_10c0 = local_15e0;
      local_10c8 = &local_13e0;
      local_f40 = CONCAT44(fStack_157c,local_1580);
      uStack_f38 = CONCAT44(fStack_1574,fStack_1578);
      uStack_f30 = CONCAT44(fStack_156c,fStack_1570);
      uStack_f28 = CONCAT44(uStack_1148._4_4_,fStack_1568);
      auVar20._4_4_ = fStack_157c;
      auVar20._0_4_ = local_1580;
      auVar20._8_4_ = fStack_1578;
      auVar20._12_4_ = fStack_1574;
      auVar20._16_4_ = fStack_1570;
      auVar20._20_4_ = fStack_156c;
      auVar20._24_4_ = fStack_1568;
      auVar20._28_4_ = uStack_1148._4_4_;
      local_15e0._0_8_ = auVar5._0_8_;
      local_f60 = local_15e0._0_8_;
      local_15e0._8_8_ = auVar5._8_8_;
      uStack_f58 = local_15e0._8_8_;
      uStack_f50 = 0;
      uStack_f48 = 0;
      local_f80 = local_a00._0_8_;
      uStack_f78 = local_a00._8_8_;
      uStack_f70 = auStack_9f0._0_8_;
      uStack_f68 = auStack_9f0._8_8_;
      auVar33._16_8_ = auStack_9f0._0_8_;
      auVar33._0_16_ = local_a00;
      auVar33._24_8_ = auStack_9f0._8_8_;
      auVar6 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar20,auVar33);
      local_10d0 = &local_1580;
      local_10d8 = &local_14c0;
      local_10e0 = &local_1480;
      local_ee0 = CONCAT44(fStack_157c,local_1580);
      uStack_ed8 = CONCAT44(fStack_1574,fStack_1578);
      uStack_ed0 = CONCAT44(fStack_156c,fStack_1570);
      uStack_ec8 = CONCAT44(uStack_1148._4_4_,fStack_1568);
      auVar21._4_4_ = fStack_157c;
      auVar21._0_4_ = local_1580;
      auVar21._8_4_ = fStack_1578;
      auVar21._12_4_ = fStack_1574;
      auVar21._16_4_ = fStack_1570;
      auVar21._20_4_ = fStack_156c;
      auVar21._24_4_ = fStack_1568;
      auVar21._28_4_ = uStack_1148._4_4_;
      local_f00 = local_840._0_8_;
      uStack_ef8 = local_840._8_8_;
      uStack_ef0 = auStack_830._0_8_;
      uStack_ee8 = auStack_830._8_8_;
      auVar26._16_8_ = auStack_830._0_8_;
      auVar26._0_16_ = local_840;
      auVar26._24_8_ = auStack_830._8_8_;
      local_f20 = local_8c0._0_8_;
      uStack_f18 = local_8c0._8_8_;
      uStack_f10 = auStack_8b0._0_8_;
      uStack_f08 = auStack_8b0._8_8_;
      auVar28._16_8_ = auStack_8b0._0_8_;
      auVar28._0_16_ = local_8c0;
      auVar28._24_8_ = auStack_8b0._8_8_;
      auVar7 = vfmadd213ps_fma(auVar26,auVar21,auVar28);
      local_10e8 = &local_1580;
      local_10f0 = local_1680;
      local_10f8 = &local_1440;
      local_e80 = CONCAT44(fStack_157c,local_1580);
      uStack_e78 = CONCAT44(fStack_1574,fStack_1578);
      uStack_e70 = CONCAT44(fStack_156c,fStack_1570);
      uStack_e68 = CONCAT44(uStack_1148._4_4_,fStack_1568);
      auVar22._4_4_ = fStack_157c;
      auVar22._0_4_ = local_1580;
      auVar22._8_4_ = fStack_1578;
      auVar22._12_4_ = fStack_1574;
      auVar22._16_4_ = fStack_1570;
      auVar22._20_4_ = fStack_156c;
      auVar22._24_4_ = fStack_1568;
      auVar22._28_4_ = uStack_1148._4_4_;
      local_1680._0_8_ = auVar7._0_8_;
      local_ea0 = local_1680._0_8_;
      local_1680._8_8_ = auVar7._8_8_;
      uStack_e98 = local_1680._8_8_;
      uStack_e90 = 0;
      uStack_e88 = 0;
      local_ec0 = local_940._0_8_;
      uStack_eb8 = local_940._8_8_;
      uStack_eb0 = auStack_930._0_8_;
      uStack_ea8 = auStack_930._8_8_;
      auVar30._16_8_ = auStack_930._0_8_;
      auVar30._0_16_ = local_940;
      auVar30._24_8_ = auStack_930._8_8_;
      auVar8 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar22,auVar30);
      local_1100 = &local_1580;
      local_1108 = local_1660;
      local_1110 = &local_1400;
      local_e20 = CONCAT44(fStack_157c,local_1580);
      uStack_e18 = CONCAT44(fStack_1574,fStack_1578);
      uStack_e10 = CONCAT44(fStack_156c,fStack_1570);
      uStack_e08 = CONCAT44(uStack_1148._4_4_,fStack_1568);
      auVar23._4_4_ = fStack_157c;
      auVar23._0_4_ = local_1580;
      auVar23._8_4_ = fStack_1578;
      auVar23._12_4_ = fStack_1574;
      auVar23._16_4_ = fStack_1570;
      auVar23._20_4_ = fStack_156c;
      auVar23._24_4_ = fStack_1568;
      auVar23._28_4_ = uStack_1148._4_4_;
      local_1660._0_8_ = auVar8._0_8_;
      local_e40 = local_1660._0_8_;
      local_1660._8_8_ = auVar8._8_8_;
      uStack_e38 = local_1660._8_8_;
      uStack_e30 = 0;
      uStack_e28 = 0;
      local_e60 = local_9c0._0_8_;
      uStack_e58 = local_9c0._8_8_;
      uStack_e50 = auStack_9b0._0_8_;
      uStack_e48 = auStack_9b0._8_8_;
      auVar32._16_8_ = auStack_9b0._0_8_;
      auVar32._0_16_ = local_9c0;
      auVar32._24_8_ = auStack_9b0._8_8_;
      auVar9 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar23,auVar32);
      local_1118 = &local_1580;
      local_1120 = local_1640;
      local_1128 = &local_13c0;
      local_dc0 = CONCAT44(fStack_157c,local_1580);
      uStack_db8 = CONCAT44(fStack_1574,fStack_1578);
      uStack_db0 = CONCAT44(fStack_156c,fStack_1570);
      uStack_da8 = CONCAT44(uStack_1148._4_4_,fStack_1568);
      auVar24._4_4_ = fStack_157c;
      auVar24._0_4_ = local_1580;
      auVar24._8_4_ = fStack_1578;
      auVar24._12_4_ = fStack_1574;
      auVar24._16_4_ = fStack_1570;
      auVar24._20_4_ = fStack_156c;
      auVar24._24_4_ = fStack_1568;
      auVar24._28_4_ = uStack_1148._4_4_;
      local_1640._0_8_ = auVar9._0_8_;
      local_de0 = local_1640._0_8_;
      local_1640._8_8_ = auVar9._8_8_;
      uStack_dd8 = local_1640._8_8_;
      uStack_dd0 = 0;
      uStack_dc8 = 0;
      local_e00 = local_a40._0_8_;
      uStack_df8 = local_a40._8_8_;
      uStack_df0 = auStack_a30._0_8_;
      uStack_de8 = auStack_a30._8_8_;
      auVar34._16_8_ = auStack_a30._0_8_;
      auVar34._0_16_ = local_a40;
      auVar34._24_8_ = auStack_a30._8_8_;
      auVar10 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar24,auVar34);
      local_1130 = &local_1560;
      local_1138 = local_15c0;
      local_1140 = local_1620;
      local_d60 = CONCAT44(fStack_155c,local_1560);
      uStack_d58 = CONCAT44(fStack_1554,fStack_1558);
      uStack_d50 = CONCAT44(fStack_154c,fStack_1550);
      uStack_d48 = CONCAT44(uStack_1148._4_4_,fStack_1548);
      auVar25._4_4_ = fStack_155c;
      auVar25._0_4_ = local_1560;
      auVar25._8_4_ = fStack_1558;
      auVar25._12_4_ = fStack_1554;
      auVar25._16_4_ = fStack_1550;
      auVar25._20_4_ = fStack_154c;
      auVar25._24_4_ = fStack_1548;
      auVar25._28_4_ = uStack_1148._4_4_;
      local_15c0._0_8_ = auVar6._0_8_;
      local_d80 = local_15c0._0_8_;
      local_15c0._8_8_ = auVar6._8_8_;
      uStack_d78 = local_15c0._8_8_;
      uStack_d70 = 0;
      uStack_d68 = 0;
      local_1620._0_8_ = auVar10._0_8_;
      local_da0 = local_1620._0_8_;
      local_1620._8_8_ = auVar10._8_8_;
      uStack_d98 = local_1620._8_8_;
      uStack_d90 = 0;
      uStack_d88 = 0;
      auVar11 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar25,ZEXT1632(auVar10));
      local_15a0._0_4_ = auVar11._0_4_;
      local_11e0 = (float)local_15a0._0_4_;
      local_15a0._4_4_ = auVar11._4_4_;
      fStack_11dc = (float)local_15a0._4_4_;
      fStack_1598 = auVar11._8_4_;
      fStack_11d8 = fStack_1598;
      fStack_1594 = auVar11._12_4_;
      fStack_11d4 = fStack_1594;
      uStack_11d0 = 0;
      uStack_11cc = 0;
      uStack_11c8 = 0;
      uStack_11c4 = 0;
      local_1200 = local_1540._0_8_;
      uStack_11f8 = local_1540._8_8_;
      uStack_11f0 = local_1540._16_8_;
      uStack_11e8 = local_1540._24_8_;
      local_1060 = (float)local_15a0._0_4_ * (float)local_1160;
      fStack_105c = (float)local_15a0._4_4_ * local_1160._4_4_;
      fStack_1058 = fStack_1598 * (float)uStack_1158;
      fStack_1054 = fStack_1594 * uStack_1158._4_4_;
      fStack_1050 = (float)uStack_1150 * 0.0;
      fStack_104c = uStack_1150._4_4_ * 0.0;
      fStack_1048 = (float)uStack_1148 * 0.0;
      local_12e0 = local_1520._0_8_;
      uStack_12d8 = local_1520._8_8_;
      uStack_12d0 = local_1520._16_8_;
      uStack_12c8 = local_1520._24_8_;
      local_1300 = local_a80._0_8_;
      uStack_12f8 = local_a80._8_8_;
      uStack_12f0 = auStack_a70._0_8_;
      uStack_12e8 = auStack_a70._8_8_;
      auVar12._16_8_ = auStack_a70._0_8_;
      auVar12._0_16_ = local_a80;
      auVar12._24_8_ = auStack_a70._8_8_;
      _local_1080 = vpand_avx2(local_1520,auVar12);
      local_d20 = local_1060 + (float)local_1080._0_4_;
      fStack_d1c = fStack_105c + (float)local_1080._4_4_;
      fStack_d18 = fStack_1058 + fStack_1078;
      fStack_d14 = fStack_1054 + fStack_1074;
      fStack_d10 = fStack_1050 + fStack_1070;
      fStack_d0c = fStack_104c + fStack_106c;
      fStack_d08 = fStack_1048 + fStack_1068;
      fStack_d04 = fStack_1064 + 0.0;
      local_d40 = local_14e0._0_8_;
      uStack_d38 = local_14e0._8_8_;
      uStack_d30 = local_14e0._16_8_;
      uStack_d28 = local_14e0._24_8_;
      auVar15._4_4_ = fStack_d1c;
      auVar15._0_4_ = local_d20;
      auVar15._8_4_ = fStack_d18;
      auVar15._12_4_ = fStack_d14;
      auVar15._16_4_ = fStack_d10;
      auVar15._20_4_ = fStack_d0c;
      auVar15._24_4_ = fStack_d08;
      auVar15._28_4_ = fStack_d04;
      local_3120 = vpor_avx2(auVar15,local_14e0);
      local_2f60 = local_3070;
      local_2f80 = local_3120._0_8_;
      uStack_2f78 = local_3120._8_8_;
      uStack_2f70 = local_3120._16_8_;
      uStack_2f68 = local_3120._24_8_;
      *(undefined1 (*) [32])*local_3070 = local_3120;
      local_3070 = (undefined1 (*) [64])(*local_3070 + 0x20);
      local_1680 = ZEXT1632(auVar7);
      local_1660 = ZEXT1632(auVar8);
      local_1640 = ZEXT1632(auVar9);
      local_1620 = ZEXT1632(auVar10);
      local_1600 = ZEXT1632(auVar51);
      local_15e0 = ZEXT1632(auVar5);
      local_15c0 = ZEXT1632(auVar6);
      _local_15a0 = ZEXT1632(auVar11);
      local_1240 = local_1320;
      uStack_1238 = uStack_1318;
      uStack_1230 = uStack_1310;
      uStack_1228 = uStack_1308;
      local_1160 = local_1540._0_8_;
      uStack_1158 = local_1540._8_8_;
      uStack_1150 = local_1540._16_8_;
      uStack_1148 = local_1540._24_8_;
      uStack_1044 = uStack_11c4;
      local_c00 = local_1320;
      uStack_bf8 = uStack_1318;
      uStack_bf0 = uStack_1310;
      uStack_be8 = uStack_1308;
      local_b1c = local_b20;
      local_b18 = local_b20;
      local_b14 = local_b20;
      local_b10 = local_b20;
      local_b0c = local_b20;
      local_b08 = local_b20;
      local_b04 = local_b20;
      local_adc = local_ae0;
      local_ad8 = local_ae0;
      local_ad4 = local_ae0;
      local_ad0 = local_ae0;
      local_acc = local_ae0;
      local_ac8 = local_ae0;
      local_ac4 = local_ae0;
      local_a9c = local_aa0;
      local_a98 = local_aa0;
      local_a94 = local_aa0;
      local_a90 = local_aa0;
      local_a8c = local_aa0;
      local_a88 = local_aa0;
      local_a84 = local_aa0;
      local_a5c = local_a60;
      local_a58 = local_a60;
      local_a54 = local_a60;
      local_a50 = local_a60;
      local_a4c = local_a60;
      local_a48 = local_a60;
      local_a44 = local_a60;
      local_a1c = local_a20;
      local_a18 = local_a20;
      local_a14 = local_a20;
      local_a10 = local_a20;
      local_a0c = local_a20;
      local_a08 = local_a20;
      local_a04 = local_a20;
      local_9dc = local_9e0;
      local_9d8 = local_9e0;
      local_9d4 = local_9e0;
      local_9d0 = local_9e0;
      local_9cc = local_9e0;
      local_9c8 = local_9e0;
      local_9c4 = local_9e0;
      local_99c = local_9a0;
      local_998 = local_9a0;
      local_994 = local_9a0;
      local_990 = local_9a0;
      local_98c = local_9a0;
      local_988 = local_9a0;
      local_984 = local_9a0;
      local_95c = local_960;
      local_958 = local_960;
      local_954 = local_960;
      local_950 = local_960;
      local_94c = local_960;
      local_948 = local_960;
      local_944 = local_960;
      local_91c = local_920;
      local_918 = local_920;
      local_914 = local_920;
      local_910 = local_920;
      local_90c = local_920;
      local_908 = local_920;
      local_904 = local_920;
      local_8dc = local_8e0;
      local_8d8 = local_8e0;
      local_8d4 = local_8e0;
      local_8d0 = local_8e0;
      local_8cc = local_8e0;
      local_8c8 = local_8e0;
      local_8c4 = local_8e0;
      local_89c = local_8a0;
      local_898 = local_8a0;
      local_894 = local_8a0;
      local_890 = local_8a0;
      local_88c = local_8a0;
      local_888 = local_8a0;
      local_884 = local_8a0;
      local_85c = local_860;
      local_858 = local_860;
      local_854 = local_860;
      local_850 = local_860;
      local_84c = local_860;
      local_848 = local_860;
      local_844 = local_860;
      local_81c = local_820;
      local_818 = local_820;
      local_814 = local_820;
      local_810 = local_820;
      local_80c = local_820;
      local_808 = local_820;
      local_804 = local_820;
    }
    for (; local_2ee8 = local_3010, local_3098 = local_2f38, local_30bc + 3 < local_3064;
        local_30bc = local_30bc + 4) {
      local_2f58 = local_3070;
      auVar51 = *(undefined1 (*) [16])*local_3070;
      local_2e98 = local_3049;
      local_2ea0 = local_3130;
      local_3130._0_8_ = auVar51._0_8_;
      local_650 = local_3130._0_8_;
      local_3130._8_8_ = auVar51._8_8_;
      uStack_648 = local_3130._8_8_;
      local_74 = 0x80000000;
      local_54 = 0x80000000;
      local_70 = 0x80000000;
      local_660 = 0x8000000080000000;
      uStack_658 = 0x8000000080000000;
      local_94 = 0x3f800000;
      local_78 = 0x3f800000;
      local_90 = 0x3f800000;
      local_670 = 0x3f8000003f800000;
      uStack_668 = 0x3f8000003f800000;
      local_b4 = 0xbf800000;
      local_98 = 0xbf800000;
      local_b0 = 0xbf800000;
      local_680 = 0xbf800000bf800000;
      uStack_678 = 0xbf800000bf800000;
      local_d4 = 0x3fc90fdb;
      local_b8 = 0x3fc90fdb;
      local_d0 = 0x3fc90fdb;
      local_690 = 0x3fc90fdb3fc90fdb;
      uStack_688 = 0x3fc90fdb3fc90fdb;
      local_f4 = 0x3f800000;
      local_d8 = 0x3f800000;
      local_f0 = 0x3f800000;
      local_6a0 = 0x3f8000003f800000;
      uStack_698 = 0x3f8000003f800000;
      local_114 = 0xbeaaaa53;
      local_f8 = 0xbeaaaa53;
      local_110 = 0xbeaaaa53;
      local_6b0 = 0xbeaaaa53beaaaa53;
      uStack_6a8 = 0xbeaaaa53beaaaa53;
      local_134 = 0x3e4cb974;
      local_118 = 0x3e4cb974;
      local_130 = 0x3e4cb974;
      local_6c0 = 0x3e4cb9743e4cb974;
      uStack_6b8 = 0x3e4cb9743e4cb974;
      local_154 = 0xbe117200;
      local_138 = 0xbe117200;
      local_150 = 0xbe117200;
      local_6d0 = 0xbe117200be117200;
      uStack_6c8 = 0xbe117200be117200;
      local_174 = 0x3dd9ed24;
      local_158 = 0x3dd9ed24;
      local_170 = 0x3dd9ed24;
      local_6e0 = 0x3dd9ed243dd9ed24;
      uStack_6d8 = 0x3dd9ed243dd9ed24;
      local_194 = 0xbd99b01e;
      local_178 = 0xbd99b01e;
      local_190 = 0xbd99b01e;
      local_6f0 = 0xbd99b01ebd99b01e;
      uStack_6e8 = 0xbd99b01ebd99b01e;
      local_1b4 = 0x3d2edd4e;
      local_198 = 0x3d2edd4e;
      local_1b0 = 0x3d2edd4e;
      local_700 = 0x3d2edd4e3d2edd4e;
      uStack_6f8 = 0x3d2edd4e3d2edd4e;
      local_1d4 = 0xbc83a25c;
      local_1b8 = 0xbc83a25c;
      local_1d0 = 0xbc83a25c;
      local_710 = 0xbc83a25cbc83a25c;
      uStack_708 = 0xbc83a25cbc83a25c;
      local_1f4 = 0x3b3ac537;
      local_1d8 = 0x3b3ac537;
      local_1f0 = 0x3b3ac537;
      local_720 = 0x3b3ac5373b3ac537;
      uStack_718 = 0x3b3ac5373b3ac537;
      auVar6._8_8_ = 0x8000000080000000;
      auVar6._0_8_ = 0x8000000080000000;
      local_730 = vpand_avx(auVar6,auVar51);
      auVar10._8_8_ = 0x8000000080000000;
      auVar10._0_8_ = 0x8000000080000000;
      local_740 = vpandn_avx(auVar10,auVar51);
      local_2a0 = local_740._0_8_;
      uStack_298 = local_740._8_8_;
      auVar8._8_8_ = 0x3f8000003f800000;
      auVar8._0_8_ = 0x3f8000003f800000;
      local_750 = vcmpps_avx(auVar8,local_740,1);
      local_5f0 = local_750._0_8_;
      uStack_5e8 = local_750._8_8_;
      auVar5._8_8_ = 0xbf800000bf800000;
      auVar5._0_8_ = 0xbf800000bf800000;
      local_2b0 = vpand_avx(local_750,auVar5);
      local_250 = local_750._0_8_;
      uStack_248 = local_750._8_8_;
      local_260 = local_740._0_8_;
      uStack_258 = local_740._8_8_;
      local_2c0 = vpandn_avx(local_750,local_740);
      local_210 = vpor_avx(local_2b0,local_2c0);
      local_610 = local_750._0_8_;
      uStack_608 = local_750._8_8_;
      local_620 = local_740._0_8_;
      uStack_618 = local_740._8_8_;
      local_2d0 = vpand_avx(local_750,local_740);
      local_270 = local_750._0_8_;
      uStack_268 = local_750._8_8_;
      auVar51 = vpternlogq_avx512vl(local_750,local_750,local_750,0xf);
      auVar9._8_8_ = 0x3f8000003f800000;
      auVar9._0_8_ = 0x3f8000003f800000;
      local_2e0 = vpand_avx(auVar51,auVar9);
      local_220 = vpor_avx(local_2d0,local_2e0);
      local_760 = vdivps_avx(local_210,local_220);
      local_580 = local_760._0_8_;
      uStack_578 = local_760._8_8_;
      local_570._0_4_ = local_760._0_4_;
      local_570._4_4_ = local_760._4_4_;
      uStack_568._0_4_ = local_760._8_4_;
      uStack_568._4_4_ = local_760._12_4_;
      local_770 = (float)local_570 * (float)local_570;
      fStack_76c = local_570._4_4_ * local_570._4_4_;
      fStack_768 = (float)uStack_568 * (float)uStack_568;
      fStack_764 = uStack_568._4_4_ * uStack_568._4_4_;
      local_590 = CONCAT44(fStack_76c,local_770);
      uStack_588 = CONCAT44(fStack_764,fStack_768);
      local_5a0 = CONCAT44(fStack_76c,local_770);
      uStack_598 = CONCAT44(fStack_764,fStack_768);
      local_780 = local_770 * local_770;
      fStack_77c = fStack_76c * fStack_76c;
      fStack_778 = fStack_768 * fStack_768;
      fStack_774 = fStack_764 * fStack_764;
      local_488 = &local_780;
      local_490 = &local_710;
      local_498 = &local_6f0;
      local_460 = CONCAT44(fStack_77c,local_780);
      uStack_458 = CONCAT44(fStack_774,fStack_778);
      auVar11._4_4_ = fStack_77c;
      auVar11._0_4_ = local_780;
      auVar11._8_4_ = fStack_778;
      auVar11._12_4_ = fStack_774;
      local_470 = 0xbc83a25cbc83a25c;
      uStack_468 = 0xbc83a25cbc83a25c;
      auVar43._8_8_ = 0xbc83a25cbc83a25c;
      auVar43._0_8_ = 0xbc83a25cbc83a25c;
      local_480 = 0xbd99b01ebd99b01e;
      uStack_478 = 0xbd99b01ebd99b01e;
      auVar45._8_8_ = 0xbd99b01ebd99b01e;
      auVar45._0_8_ = 0xbd99b01ebd99b01e;
      local_7c0 = vfmadd213ps_fma(auVar43,auVar11,auVar45);
      local_4a0 = &local_780;
      local_4a8 = local_7c0;
      local_4b0 = &local_6d0;
      local_430 = CONCAT44(fStack_77c,local_780);
      uStack_428 = CONCAT44(fStack_774,fStack_778);
      auVar35._4_4_ = fStack_77c;
      auVar35._0_4_ = local_780;
      auVar35._8_4_ = fStack_778;
      auVar35._12_4_ = fStack_774;
      local_440 = local_7c0._0_8_;
      uStack_438 = local_7c0._8_8_;
      local_450 = 0xbe117200be117200;
      uStack_448 = 0xbe117200be117200;
      auVar47._8_8_ = 0xbe117200be117200;
      auVar47._0_8_ = 0xbe117200be117200;
      local_7b0 = vfmadd213ps_fma(local_7c0,auVar35,auVar47);
      local_4b8 = &local_780;
      local_4c0 = local_7b0;
      local_4c8 = &local_6b0;
      local_400 = CONCAT44(fStack_77c,local_780);
      uStack_3f8 = CONCAT44(fStack_774,fStack_778);
      auVar36._4_4_ = fStack_77c;
      auVar36._0_4_ = local_780;
      auVar36._8_4_ = fStack_778;
      auVar36._12_4_ = fStack_774;
      local_410 = local_7b0._0_8_;
      uStack_408 = local_7b0._8_8_;
      local_420 = 0xbeaaaa53beaaaa53;
      uStack_418 = 0xbeaaaa53beaaaa53;
      auVar49._8_8_ = 0xbeaaaa53beaaaa53;
      auVar49._0_8_ = 0xbeaaaa53beaaaa53;
      local_7a0 = vfmadd213ps_fma(local_7b0,auVar36,auVar49);
      local_4d0 = &local_780;
      local_4d8 = &local_720;
      local_4e0 = &local_700;
      local_3d0 = CONCAT44(fStack_77c,local_780);
      uStack_3c8 = CONCAT44(fStack_774,fStack_778);
      auVar37._4_4_ = fStack_77c;
      auVar37._0_4_ = local_780;
      auVar37._8_4_ = fStack_778;
      auVar37._12_4_ = fStack_774;
      local_3e0 = 0x3b3ac5373b3ac537;
      uStack_3d8 = 0x3b3ac5373b3ac537;
      auVar42._8_8_ = 0x3b3ac5373b3ac537;
      auVar42._0_8_ = 0x3b3ac5373b3ac537;
      local_3f0 = 0x3d2edd4e3d2edd4e;
      uStack_3e8 = 0x3d2edd4e3d2edd4e;
      auVar44._8_8_ = 0x3d2edd4e3d2edd4e;
      auVar44._0_8_ = 0x3d2edd4e3d2edd4e;
      local_800 = vfmadd213ps_fma(auVar42,auVar37,auVar44);
      local_4e8 = &local_780;
      local_4f0 = local_800;
      local_4f8 = &local_6e0;
      local_3a0 = CONCAT44(fStack_77c,local_780);
      uStack_398 = CONCAT44(fStack_774,fStack_778);
      auVar38._4_4_ = fStack_77c;
      auVar38._0_4_ = local_780;
      auVar38._8_4_ = fStack_778;
      auVar38._12_4_ = fStack_774;
      local_3b0 = local_800._0_8_;
      uStack_3a8 = local_800._8_8_;
      local_3c0 = 0x3dd9ed243dd9ed24;
      uStack_3b8 = 0x3dd9ed243dd9ed24;
      auVar46._8_8_ = 0x3dd9ed243dd9ed24;
      auVar46._0_8_ = 0x3dd9ed243dd9ed24;
      local_7f0 = vfmadd213ps_fma(local_800,auVar38,auVar46);
      local_500 = &local_780;
      local_508 = local_7f0;
      local_510 = &local_6c0;
      local_370 = CONCAT44(fStack_77c,local_780);
      uStack_368 = CONCAT44(fStack_774,fStack_778);
      auVar39._4_4_ = fStack_77c;
      auVar39._0_4_ = local_780;
      auVar39._8_4_ = fStack_778;
      auVar39._12_4_ = fStack_774;
      local_380 = local_7f0._0_8_;
      uStack_378 = local_7f0._8_8_;
      local_390 = 0x3e4cb9743e4cb974;
      uStack_388 = 0x3e4cb9743e4cb974;
      auVar48._8_8_ = 0x3e4cb9743e4cb974;
      auVar48._0_8_ = 0x3e4cb9743e4cb974;
      local_7e0 = vfmadd213ps_fma(local_7f0,auVar39,auVar48);
      local_518 = &local_780;
      local_520 = local_7e0;
      local_528 = &local_6a0;
      local_340 = CONCAT44(fStack_77c,local_780);
      uStack_338 = CONCAT44(fStack_774,fStack_778);
      auVar40._4_4_ = fStack_77c;
      auVar40._0_4_ = local_780;
      auVar40._8_4_ = fStack_778;
      auVar40._12_4_ = fStack_774;
      local_350 = local_7e0._0_8_;
      uStack_348 = local_7e0._8_8_;
      local_360 = 0x3f8000003f800000;
      uStack_358 = 0x3f8000003f800000;
      auVar50._8_8_ = 0x3f8000003f800000;
      auVar50._0_8_ = 0x3f8000003f800000;
      local_7d0 = vfmadd213ps_fma(local_7e0,auVar40,auVar50);
      local_530 = &local_770;
      local_538 = local_7a0;
      local_540 = local_7d0;
      local_310 = CONCAT44(fStack_76c,local_770);
      uStack_308 = CONCAT44(fStack_764,fStack_768);
      auVar41._4_4_ = fStack_76c;
      auVar41._0_4_ = local_770;
      auVar41._8_4_ = fStack_768;
      auVar41._12_4_ = fStack_764;
      local_320 = local_7a0._0_8_;
      uStack_318 = local_7a0._8_8_;
      local_330 = local_7d0._0_8_;
      uStack_328 = local_7d0._8_8_;
      local_790 = vfmadd213ps_fma(local_7a0,auVar41,local_7d0);
      local_5c0 = local_760._0_8_;
      uStack_5b8 = local_760._8_8_;
      local_5b0._0_4_ = local_790._0_4_;
      local_5b0._4_4_ = local_790._4_4_;
      uStack_5a8._0_4_ = local_790._8_4_;
      uStack_5a8._4_4_ = local_790._12_4_;
      local_550 = (float)local_5b0 * (float)local_570;
      fStack_54c = local_5b0._4_4_ * local_570._4_4_;
      fStack_548 = (float)uStack_5a8 * (float)uStack_568;
      fStack_544 = uStack_5a8._4_4_ * uStack_568._4_4_;
      local_630 = local_750._0_8_;
      uStack_628 = local_750._8_8_;
      auVar51._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar51._0_8_ = 0x3fc90fdb3fc90fdb;
      _local_560 = vpand_avx(local_750,auVar51);
      local_2f0 = local_550 + (float)local_560._0_4_;
      fStack_2ec = fStack_54c + (float)local_560._4_4_;
      fStack_2e8 = fStack_548 + fStack_558;
      fStack_2e4 = fStack_544 + fStack_554;
      local_300 = local_730._0_8_;
      uStack_2f8 = local_730._8_8_;
      auVar7._4_4_ = fStack_2ec;
      auVar7._0_4_ = local_2f0;
      auVar7._8_4_ = fStack_2e8;
      auVar7._12_4_ = fStack_2e4;
      local_3130 = vpor_avx(auVar7,local_730);
      local_2f40 = local_3070;
      local_2f50 = local_3130._0_8_;
      uStack_2f48 = local_3130._8_8_;
      *(undefined1 (*) [16])*local_3070 = local_3130;
      local_3070 = (undefined1 (*) [64])(*local_3070 + 0x10);
      local_640 = local_690;
      uStack_638 = uStack_688;
      local_600 = local_680;
      uStack_5f8 = uStack_678;
      local_5e0 = local_650;
      uStack_5d8 = uStack_648;
      local_5d0 = local_660;
      uStack_5c8 = uStack_658;
      local_5b0 = local_790._0_8_;
      uStack_5a8 = local_790._8_8_;
      local_570 = local_760._0_8_;
      uStack_568 = local_760._8_8_;
      local_290 = local_670;
      uStack_288 = uStack_668;
      local_280 = local_670;
      uStack_278 = uStack_668;
      local_240 = local_650;
      uStack_238 = uStack_648;
      local_230 = local_660;
      uStack_228 = uStack_658;
      uStack_1ec = local_1f0;
      uStack_1e8 = local_1f0;
      uStack_1e4 = local_1f0;
      uStack_1cc = local_1d0;
      uStack_1c8 = local_1d0;
      uStack_1c4 = local_1d0;
      uStack_1ac = local_1b0;
      uStack_1a8 = local_1b0;
      uStack_1a4 = local_1b0;
      uStack_18c = local_190;
      uStack_188 = local_190;
      uStack_184 = local_190;
      uStack_16c = local_170;
      uStack_168 = local_170;
      uStack_164 = local_170;
      uStack_14c = local_150;
      uStack_148 = local_150;
      uStack_144 = local_150;
      uStack_12c = local_130;
      uStack_128 = local_130;
      uStack_124 = local_130;
      uStack_10c = local_110;
      uStack_108 = local_110;
      uStack_104 = local_110;
      uStack_ec = local_f0;
      uStack_e8 = local_f0;
      uStack_e4 = local_f0;
      uStack_cc = local_d0;
      uStack_c8 = local_d0;
      uStack_c4 = local_d0;
      uStack_ac = local_b0;
      uStack_a8 = local_b0;
      uStack_a4 = local_b0;
      uStack_8c = local_90;
      uStack_88 = local_90;
      uStack_84 = local_90;
      uStack_6c = local_70;
      uStack_68 = local_70;
      uStack_64 = local_70;
    }
    for (; local_30bc < local_3064; local_30bc = local_30bc + 1) {
      local_2e88 = local_3049;
      local_2e90 = local_3070;
      fVar56 = atanf(*(float *)*local_3070);
      *(float *)*local_3070 = fVar56;
      local_3070 = (undefined1 (*) [64])(*local_3070 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}